

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::record_raytracing_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkRayTracingPipelineCreateInfoKHR *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  Impl *pIVar1;
  bool bVar2;
  int iVar3;
  VkRayTracingPipelineCreateInfoKHR *pVVar4;
  ulong uVar5;
  VkPipelineShaderStageCreateInfo *pVVar6;
  mutex *__mutex;
  VkRayTracingPipelineCreateInfoKHR *new_info;
  WorkItem local_50;
  
  pVVar4 = create_info;
  do {
    pVVar4 = (VkRayTracingPipelineCreateInfoKHR *)pVVar4->pNext;
    if (pVVar4 == (VkRayTracingPipelineCreateInfoKHR *)0x0) goto LAB_0012853c;
  } while (pVVar4->sType != VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR);
  bVar2 = true;
  if (pVVar4->flags == 0) {
LAB_0012853c:
    pIVar1 = this->impl;
    if ((ulong)create_info->stageCount != 0) {
      uVar5 = 0;
      do {
        if (create_info->pStages[uVar5].module == (VkShaderModule)0x0) {
          pVVar6 = create_info->pStages + uVar5;
          do {
            pVVar6 = (VkPipelineShaderStageCreateInfo *)pVVar6->pNext;
            if (pVVar6 == (VkPipelineShaderStageCreateInfo *)0x0) {
              if (pIVar1->should_record_identifier_only == false) {
                iVar3 = pthread_mutex_lock((pthread_mutex_t *)&pIVar1->record_lock);
                if (iVar3 != 0) goto LAB_0012867e;
                if (pipeline != (VkPipeline)0x0) {
                  Impl::push_unregister_locked<VkPipeline_T*>
                            (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,
                             pipeline);
                }
                pthread_mutex_unlock((pthread_mutex_t *)&pIVar1->record_lock);
                goto LAB_0012866d;
              }
              break;
            }
          } while (pVVar6->sType != VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != create_info->stageCount);
    }
    __mutex = &pIVar1->record_lock;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
LAB_0012867e:
      std::__throw_system_error(iVar3);
    }
    new_info = (VkRayTracingPipelineCreateInfoKHR *)0x0;
    bVar2 = Impl::copy_raytracing_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar2) {
      local_50.type = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      Impl::pump_synchronized_recording(this->impl,this);
LAB_0012866d:
      bVar2 = true;
    }
    else {
      if (pipeline != (VkPipeline)0x0) {
        Impl::push_unregister_locked<VkPipeline_T*>
                  (this->impl,VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,pipeline);
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool StateRecorder::record_raytracing_pipeline(
		VkPipeline pipeline, const VkRayTracingPipelineCreateInfoKHR &create_info,
		const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
		Hash custom_hash,
		VkDevice device,
		PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// If we are using module identifier data + on use, we need to push it for record.
	for (uint32_t i = 0; i < create_info.stageCount; i++)
	{
		if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
		    !impl->should_record_identifier_only)
		{
			std::lock_guard<std::mutex> lock(impl->record_lock);
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return true;
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkRayTracingPipelineCreateInfoKHR *new_info = nullptr;
		if (!impl->copy_raytracing_pipeline(&create_info, impl->temp_allocator,
		                                    base_pipelines, base_pipeline_count,
		                                    device, gsmcii,
		                                    &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR,
		                        api_object_cast<uint64_t>(pipeline), new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}